

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool ReplaceDefineInternal(char *lp,char *nl)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  ulong *name;
  ulong *puVar5;
  char *pcVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  CStringsList *pCVar10;
  byte *pbVar11;
  uint uVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  char *rp;
  char *kp;
  char defarrayCountTxt [16];
  byte *local_88;
  byte local_7a;
  byte local_79;
  byte *local_78;
  undefined1 local_6d;
  int local_6c;
  uint local_68;
  int local_64;
  byte *local_60;
  ulong local_58 [3];
  byte *local_40;
  byte *local_38;
  
  local_58[0] = 0;
  local_58[1] = 0;
  local_40 = (byte *)temp;
  local_68 = 0;
  local_64 = 0;
  local_88 = (byte *)lp;
  local_78 = (byte *)nl;
  bVar7 = 1;
  do {
    pbVar2 = local_78;
    pbVar11 = local_88;
    bVar8 = *local_88;
    if ((bVar8 == 0) || (0x7ff < (long)local_78 - (long)nl)) break;
    bVar9 = local_88[1];
    iVar3 = isalnum((uint)bVar8);
    bVar13 = iVar3 == 0;
    if (bVar9 == 0x2a && bVar8 == 0x2f) {
      comlin = comlin + 1;
      local_88 = pbVar11 + 2;
LAB_00120ea1:
      bVar14 = false;
    }
    else {
      pbVar1 = pbVar11 + 1;
      bVar9 = bVar9 ^ 0x2f;
      if (comlin != 0) {
        local_88 = pbVar1;
        if (bVar8 == 0x2a && bVar9 == 0) {
          if (comlin == 1) {
            local_78 = pbVar2 + 1;
            *pbVar2 = 0x20;
          }
          comlin = comlin + -1;
          local_88 = pbVar11 + 2;
        }
        goto LAB_00120ea1;
      }
      if ((bVar8 == 0x3b) || (bVar8 == 0x2f && bVar9 == 0)) {
        bVar14 = true;
        if ((pbVar11 < local_40 && (undefined *)0x18da1f < pbVar11) && eolComment == (char *)0x0) {
          eolComment = (char *)pbVar11;
        }
      }
      else {
        if (((bVar7 & 1) != 0) && ((bVar8 == 0x27 || (bVar8 == 0x22)))) {
          local_78 = pbVar2 + 1;
          *pbVar2 = *pbVar11;
          bVar7 = *pbVar1;
          bVar14 = bVar7 == 0;
          local_88 = pbVar1;
          if (bVar8 != bVar7 && !bVar14) {
            do {
              if ((bVar7 == 0x5c && bVar8 == 0x22) && (local_88[1] != 0)) {
                *local_78 = *local_88;
                local_88 = local_88 + 1;
                local_78 = local_78 + 1;
              }
              pbVar11 = local_88 + 1;
              pbVar2 = local_78 + 1;
              *local_78 = *local_88;
              bVar7 = *pbVar11;
              bVar14 = bVar7 == 0;
              local_88 = pbVar11;
              local_78 = pbVar2;
            } while ((!bVar14) && (bVar8 != bVar7));
          }
          if (!bVar14) {
            *local_78 = *local_88;
            local_88 = local_88 + 1;
            local_78 = local_78 + 1;
          }
          goto LAB_00120ea1;
        }
        local_7a = bVar13;
        bVar14 = isLabelStart((char *)pbVar11,false);
        if (bVar14) {
          local_60 = local_88;
          uVar12 = 0;
          if ((bVar7 & 1) != 0) {
            iVar3 = cmphstr((char **)&local_60,"define+",false);
            uVar12 = 1;
            if (((((iVar3 == 0) && (iVar3 = cmphstr((char **)&local_60,"define",false), iVar3 == 0))
                 && (iVar3 = cmphstr((char **)&local_60,"undefine",false), iVar3 == 0)) &&
                ((iVar3 = cmphstr((char **)&local_60,"defarray+",false), iVar3 == 0 &&
                 (iVar3 = cmphstr((char **)&local_60,"defarray",false), iVar3 == 0)))) &&
               (iVar3 = cmphstr((char **)&local_60,"ifdef",false), iVar3 == 0)) {
              iVar3 = cmphstr((char **)&local_60,"ifndef",false);
              uVar12 = (uint)(iVar3 != 0);
            }
          }
          local_68 = (byte)local_68 & 1 | uVar12;
          ResetGrowSubId();
          local_38 = local_88;
          pbVar11 = local_88;
          do {
            name = (ulong *)GrowSubId((char **)&local_88);
            bVar14 = (byte)*name == 0x5f;
            bVar15 = pbVar11 != local_38;
            if (((macrolabp == (char *)0x0) || (bVar15 && bVar14)) ||
               (puVar5 = (ulong *)CMacroDefineTable::getverv(&MacroDefineTable,(char *)name),
               puVar5 == (ulong *)0x0)) {
              iVar3 = 0;
              if (((!bVar15 || !bVar14) && (local_68 & 1) == 0) &&
                 (puVar5 = (ulong *)CDefineTable::Get(&DefineTable,(char *)name),
                 pCVar10 = DefineTable.DefArrayList, puVar5 != (ulong *)0x0)) {
                if (DefineTable.DefArrayList == (CStringsList *)0x0) {
                  iVar3 = 1;
                  name = puVar5;
                }
                else {
                  while (bVar14 = White(*local_88), bVar14) {
                    GrowSubIdByExtraChar((char **)&local_88);
                  }
                  if (*local_88 != 0x5b) {
                    Error("[ARRAY] Expression error",(char *)pbVar11,SUPPRESS);
                  }
                  pbVar2 = local_88;
                  bVar7 = *local_88;
                  if (((bVar7 == 0x5b) && (local_88[1] == 0x23)) && (local_88[2] == 0x5d)) {
                    local_88 = local_88 + 3;
                    local_6c = 0;
                    do {
                      local_6c = local_6c + 1;
                      pCVar10 = pCVar10->next;
                    } while (pCVar10 != (CStringsList *)0x0);
                    snprintf((char *)local_58,0x10,"%d");
                    iVar3 = 1;
                    name = local_58;
                  }
                  else {
                    IsLabelNotFound = false;
                    bVar8 = bVar7 == 0x5b;
                    if ((*local_88 == 0x5b) &&
                       (local_79 = bVar7 == 0x5b, pcVar6 = GrowSubIdByExtraChar((char **)&local_88),
                       bVar8 = local_79, pcVar6 != (char *)0x0)) {
                      if (IsSubstituting == true) {
                        __assert_fail("!IsSubstituting",
                                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                                      ,0x18d,"int ParseExpressionInSubstitution(char *&, aint &)");
                      }
                      IsSubstituting = true;
                      local_6d = synerr;
                      synerr = 1;
                      iVar3 = ParseExpression((char **)&local_88,&local_6c);
                      synerr = local_6d;
                      IsSubstituting = false;
                      bVar8 = local_79;
                      if (((iVar3 != 0) && (*local_88 == 0x5d)) && (IsLabelNotFound == false)) {
                        local_88 = local_88 + 1;
                        iVar3 = local_6c;
                        if (0 < local_6c) {
                          do {
                            pCVar10 = pCVar10->next;
                            local_6c = iVar3 + -1;
                            if (iVar3 < 2) break;
                            iVar3 = local_6c;
                          } while (pCVar10 != (CStringsList *)0x0);
                        }
                        if (pCVar10 == (CStringsList *)0x0 || local_6c < 0) {
                          local_58[0] = local_58[0] & 0xffffffffffffff00;
                          Error("[ARRAY] index not in 0..<Size-1> range",(char *)pbVar11,SUPPRESS);
                          iVar3 = 1;
                          name = local_58;
                        }
                        else {
                          iVar3 = 1;
                          name = (ulong *)pCVar10->string;
                        }
                        goto LAB_001211a7;
                      }
                    }
                    local_88 = pbVar2 + bVar8;
                    iVar3 = -1;
                  }
                }
              }
            }
            else {
              iVar3 = 2;
              name = puVar5;
            }
LAB_001211a7:
            if (iVar3 == 0) {
              iVar4 = islabchar(*local_88);
              iVar3 = 0;
              if (iVar4 == 0) {
                local_88 = pbVar11;
                ResetGrowSubId();
                name = (ulong *)GrowSubId((char **)&local_88);
                iVar3 = -1;
              }
            }
            if (0 < iVar3) {
              local_64 = 1;
            }
            if (iVar3 != 0) {
              bVar7 = (byte)*name;
              if ((long)local_78 - (long)nl < 0x800 && bVar7 != 0) {
                do {
                  name = (ulong *)((long)name + 1);
                  pbVar11 = local_78 + 1;
                  *local_78 = bVar7;
                  bVar7 = *(byte *)name;
                  local_78 = pbVar11;
                  if (bVar7 == 0) break;
                } while ((long)pbVar11 - (long)nl < 0x800);
              }
              ResetGrowSubId();
              pbVar11 = local_88;
            }
            iVar3 = islabchar(*local_88);
          } while (iVar3 != 0);
        }
        else {
          *local_78 = *local_88;
          local_88 = local_88 + 1;
          local_78 = local_78 + 1;
        }
        bVar14 = false;
        bVar13 = local_7a;
      }
    }
    bVar7 = bVar13;
  } while (!bVar14);
  *local_78 = 0;
  if (0x7ff < (long)(local_78 + 1) - (long)nl) {
    local_78 = local_78 + 1;
    Error("line too long after macro expansion",nl,SUPPRESS);
  }
  local_78 = (byte *)nl;
  iVar3 = SkipBlanks((char **)&local_78);
  if (iVar3 != 0) {
    *nl = '\0';
  }
  substitutedLine = nl;
  return local_64 != 0;
}

Assistant:

static bool ReplaceDefineInternal(char* lp, char* const nl) {
	int definegereplaced = 0,dr;
	char* rp = nl,* nid;
	const char* ver;
	bool isDefDir = false;	// to remember if one of DEFINE-related directives was used
	bool afterNonAlphaNum, afterNonAlphaNumNext = true;
	char defarrayCountTxt[16] = { 0 };
	while (*lp && ((rp - nl) < LINEMAX)) {
		const char c1 = lp[0], c2 = lp[1];
		afterNonAlphaNum = afterNonAlphaNumNext;
		afterNonAlphaNumNext = !isalnum((byte)c1);
		if (c1 == '/' && c2 == '*') {	// block-comment local beginning (++block_nesting)
			lp += 2;
			++comlin;
			continue;
		}
		if (comlin) {
			if (c1 == '*' && c2 == '/') {
				lp += 2;
				// insert space into line, if the block ending may have affected parsing of line
				if (1 == comlin) {
					*rp++ = ' ';		// ^^ otherwise this line is completely commented out
				}
				--comlin;	// decrement block comment counter
			} else {
				++lp;		// just skip all characters inside comment block
			}
			continue;
		}
		// for following code (0 == comlin) (unless it has its own parse loop)

		// single line comments -> finish
		if (c1 == ';' || (c1 == '/' && c2 == '/')) {
			// set empty eol line comment, if the source of data is still the original "line" buffer
			if (!eolComment && line <= lp && lp < line+LINEMAX) eolComment = lp;
			break;
		}

		// strings parsing
		if (afterNonAlphaNum && (c1 == '"' || c1 == '\'')) {
			*rp++ = *lp++;				// copy the string delimiter (" or ')
			// apostrophe inside apostrophes ('') will parse as end + start of another string
			// which sort of "accidentally" leads to correct final results
			while (*lp && c1 != *lp) {	// until end of current string is reached (or line ends)
				// inside double quotes the backslash should escape (anything after it)
				if ('"' == c1 && '\\' == *lp && lp[1]) *rp++ = *lp++;	// copy escaping backslash extra
				*rp++ = *lp++;			// copy string character
			}
			if (*lp) *rp++ = *lp++;		// copy the ending string delimiter (" or ')
			continue;
		}

		if (!isLabelStart(lp, false)) {
			*rp++ = *lp++;
			continue;
		}

		// update "is define-related directive" for remainder of the line
		char* kp = lp;
		isDefDir |= afterNonAlphaNum && (cmphstr(kp, "define+") || cmphstr(kp, "define")
			|| cmphstr(kp, "undefine") || cmphstr(kp, "defarray+") || cmphstr(kp, "defarray")
			|| cmphstr(kp, "ifdef") || cmphstr(kp, "ifndef"));
		// if DEFINE-related directive was used, only macro-arguments are substituted
		// in the remaining part of the line, the define-based substitution is inhibited till EOL

		// The following loop is recursive-like macro/define substitution, the `*lp` here points
		// at alphabet/underscore char, marking start of "id" string, and it will be parsed by
		// sub-id parts, delimited by underscores, each combination of consecutive sub-ids may
		// be substituted by some macro argument or define.

		//TODO - maybe consider the substitution search to go downward, from longest term to shortest subterm
		ResetGrowSubId();
		char* nextSubIdLp = lp, * wholeIdLp = lp;
		do { //while(islabchar(*lp));
			nid = GrowSubId(lp);		// grow the current sub-id part by part, checking each combination for substitution
			// defines/macro arguments can substitute in the middle of ID only if they don't start with underscore
			const bool canSubstituteInside = '_' != nid[0] || nextSubIdLp == wholeIdLp;
			if (macrolabp && canSubstituteInside && (ver = MacroDefineTable.getverv(nid))) {
				dr = 2;			// macro argument substitution is possible
			} else if (!isDefDir && canSubstituteInside && (ver = DefineTable.Get(nid))) {
				dr = 1;			// DEFINE substitution is possible
				//handle DEFARRAY case
				if (DefineTable.DefArrayList) {
					ver = nid;	// in case of some error, just copy the array id "as is"
					CStringsList* a = DefineTable.DefArrayList;
					while (White(*lp)) GrowSubIdByExtraChar(lp);
					aint val;
					if ('[' != *lp) Error("[ARRAY] Expression error", nextSubIdLp, SUPPRESS);
					if ('[' == *lp && '#' == lp[1] && ']' == lp[2]) {	// calculate size of defarray
						lp += 3;
						val = 0;
						while (a) {
							++val;
							a = a->next;
						}
						SPRINTF1(defarrayCountTxt, 16, "%d", val);
						ver = defarrayCountTxt;
					} else {
						char* expLp = lp + ('[' == *lp);	// the '[' will become part of subId in didParseBrackets
						IsLabelNotFound = false;
						bool didParseBrackets = '[' == *lp && GrowSubIdByExtraChar(lp) && ParseExpressionInSubstitution(lp, val) && ']' == *lp;
						if (didParseBrackets && !IsLabelNotFound) {
							// expression was successfully parsed and all values were known
							++lp;
							while (0 < val && a) {
								a = a->next;
								--val;
							}
							if (val < 0 || NULL == a) {
								*defarrayCountTxt = 0;		// substitute with empty string
								ver = defarrayCountTxt;
								Error("[ARRAY] index not in 0..<Size-1> range", nextSubIdLp, SUPPRESS);
							} else {
								ver = a->string;	// substitute with array value
							}
						} else {	// no substition of array possible at this time (index eval / syntax error)
							lp = expLp;				// restore lp in case expression parser went ahead a lot
							dr = -1;// write into output, but don't count as replacement
						}
					}
				}
			} else {
				dr = 0;			// no possible substitution found
				ver = nid;
			}
			// check if no substition was found, and there's no more chars to extend SubId
			if (0 == dr && !islabchar(*lp)) {
				lp = nextSubIdLp;		// was fully extended, no match, "eat" first subId
				ResetGrowSubId();
				ver = GrowSubId(lp);	// find the first SubId again, for the copy
				dr = -1;				// write into output, but don't count as replacement
			}
			if (0 < dr) definegereplaced = 1;		// above zero => count as replacement
			if (0 != dr) {				// any non-zero dr => write to the output
				while (*ver && ((rp - nl) < LINEMAX)) *rp++ = *ver++;		// replace the string into target buffer
				// reset subId parser to catch second+ subId in current Id
				ResetGrowSubId();
				nextSubIdLp = lp;
			}
			// continue with extending the subId, if there's still something to parse
		} while(islabchar(*lp));
	} // while(*lp)
	// add line terminator to the output buffer
	*rp++ = 0;
	if (LINEMAX <= (rp - nl)) {
		Error("line too long after macro expansion", nl, SUPPRESS);
	}
	// check if whole line is just blanks, then return just empty one
	rp = nl;
	if (SkipBlanks(rp)) *nl = 0;
	substitutedLine = nl;		// set global pointer to the latest substituted version
	return definegereplaced;
}